

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

void __thiscall
ParseContext::ParseContext
          (ParseContext *this,Allocator *allocator,int optimizationLevel,
          ArrayView<InplaceStr> activeImports)

{
  Node *pNVar1;
  undefined8 *puVar2;
  uint uVar3;
  InplaceStr *pIVar4;
  char *pcVar5;
  long lVar6;
  
  Lexer::Lexer(&this->lexer,allocator);
  lVar6 = 0x460;
  do {
    *(undefined8 *)((long)(this->lexer).lexems.little + lVar6 + -0x10) = 0;
    puVar2 = (undefined8 *)((long)(this->lexer).lexems.little + lVar6 + -0x28);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined4 *)((long)(this->lexer).lexems.little + lVar6 + -0x18) = 0;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x860);
  (this->binaryOpStack).allocator = allocator;
  (this->binaryOpStack).data = (this->binaryOpStack).little;
  (this->binaryOpStack).count = 0;
  (this->binaryOpStack).max = 0x20;
  (this->namespaceList).allocator = allocator;
  (this->namespaceList).data = (this->namespaceList).little;
  (this->namespaceList).count = 0;
  (this->namespaceList).max = 0x20;
  this->optimizationLevel = optimizationLevel;
  (this->activeImports).little[0].begin = (char *)0x0;
  (this->activeImports).little[0].end = (char *)0x0;
  (this->activeImports).little[1].begin = (char *)0x0;
  (this->activeImports).little[1].end = (char *)0x0;
  (this->activeImports).little[2].begin = (char *)0x0;
  (this->activeImports).little[2].end = (char *)0x0;
  (this->activeImports).little[3].begin = (char *)0x0;
  (this->activeImports).little[3].end = (char *)0x0;
  (this->activeImports).little[4].begin = (char *)0x0;
  (this->activeImports).little[4].end = (char *)0x0;
  (this->activeImports).little[5].begin = (char *)0x0;
  (this->activeImports).little[5].end = (char *)0x0;
  (this->activeImports).little[6].begin = (char *)0x0;
  (this->activeImports).little[6].end = (char *)0x0;
  (this->activeImports).little[7].begin = (char *)0x0;
  (this->activeImports).little[7].end = (char *)0x0;
  (this->activeImports).allocator = allocator;
  (this->activeImports).data = (this->activeImports).little;
  (this->activeImports).max = 8;
  (this->activeImports).count = 0;
  (this->errorInfo).allocator = allocator;
  (this->errorInfo).data = (this->errorInfo).little;
  (this->errorInfo).count = 0;
  (this->errorInfo).max = 4;
  CompilerStatistics::CompilerStatistics(&this->statistics);
  (this->nonTypeLocations).allocator = allocator;
  (this->nonTypeLocations).bucketCount = 0x80;
  (this->nonTypeLocations).count = 0;
  pNVar1 = (this->nonTypeLocations).storage;
  (this->nonTypeLocations).data = pNVar1;
  NULLC::fillMemory(pNVar1,0,0x400);
  (this->nonFunctionDefinitionLocations).allocator = allocator;
  (this->nonFunctionDefinitionLocations).bucketCount = 0x80;
  (this->nonFunctionDefinitionLocations).count = 0;
  pNVar1 = (this->nonFunctionDefinitionLocations).storage;
  (this->nonFunctionDefinitionLocations).data = pNVar1;
  NULLC::fillMemory(pNVar1,0,0x400);
  this->allocator = allocator;
  this->expressionGroupDepth = 0;
  this->expressionBlockDepth = 0;
  this->statementBlockDepth = 0;
  this->errorHandlerActive = false;
  this->errorPos = (char *)0x0;
  this->errorCount = 0;
  this->errorBuf = (char *)0x0;
  this->errorBufSize = 0;
  this->errorBufLocation = (char *)0x0;
  this->currentNamespace = (SynNamespaceElement *)0x0;
  this->code = (char *)0x0;
  this->moduleRoot = (char *)0x0;
  this->bytecodeBuilder =
       (_func_char_ptr_Allocator_ptr_InplaceStr_char_ptr_bool_char_ptr_ptr_char_ptr_uint_int_ArrayView<InplaceStr>_CompilerStatistics_ptr
        *)0x0;
  this->firstLexeme = (Lexeme *)0x0;
  this->currentLexeme = (Lexeme *)0x0;
  this->lastLexeme = (Lexeme *)0x0;
  if (activeImports.count != 0) {
    lVar6 = 0;
    do {
      uVar3 = (this->activeImports).count;
      if (uVar3 == (this->activeImports).max) {
        SmallArray<InplaceStr,_8U>::grow(&this->activeImports,uVar3);
      }
      pIVar4 = (this->activeImports).data;
      if (pIVar4 == (InplaceStr *)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<InplaceStr, 8>::push_back(const T &) [T = InplaceStr, N = 8]"
                     );
      }
      puVar2 = (undefined8 *)((long)&(activeImports.data)->begin + lVar6);
      uVar3 = (this->activeImports).count;
      (this->activeImports).count = uVar3 + 1;
      pcVar5 = (char *)puVar2[1];
      pIVar4 = pIVar4 + uVar3;
      pIVar4->begin = (char *)*puVar2;
      pIVar4->end = pcVar5;
      lVar6 = lVar6 + 0x10;
    } while ((activeImports._8_8_ & 0xffffffff) << 4 != lVar6);
  }
  return;
}

Assistant:

ParseContext::ParseContext(Allocator *allocator, int optimizationLevel, ArrayView<InplaceStr> activeImports): lexer(allocator), binaryOpStack(allocator), namespaceList(allocator), optimizationLevel(optimizationLevel), activeImports(allocator), errorInfo(allocator), nonTypeLocations(allocator), nonFunctionDefinitionLocations(allocator), allocator(allocator)
{
	code = NULL;

	moduleRoot = NULL;

	bytecodeBuilder = NULL;

	firstLexeme = NULL;
	currentLexeme = NULL;
	lastLexeme = NULL;

	expressionGroupDepth = 0;
	expressionBlockDepth = 0;
	statementBlockDepth = 0;

	errorHandlerActive = false;
	errorPos = NULL;
	errorCount = 0;
	errorBuf = NULL;
	errorBufSize = 0;
	errorBufLocation = NULL;

	currentNamespace = NULL;

	for(unsigned i = 0; i < activeImports.size(); i++)
		this->activeImports.push_back(activeImports[i]);
}